

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O1

int substricmp(char *nptr,char *subsrt)

{
  char cVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  
  cVar4 = *subsrt;
  if (cVar4 != '\0') {
    lVar3 = 0;
    do {
      cVar1 = nptr[lVar3];
      iVar2 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        iVar2 = (int)cVar1;
      }
      iVar5 = cVar4 + -0x20;
      if (0x19 < (byte)(cVar4 + 0x9fU)) {
        iVar5 = (int)cVar4;
      }
      cVar4 = subsrt[lVar3 + 1];
    } while ((cVar4 != '\0') && (lVar3 = lVar3 + 1, iVar2 - iVar5 == 0));
    return iVar2 - iVar5;
  }
  return 0;
}

Assistant:

static int substricmp(const char* nptr, const char* subsrt)
{
    int result = 0;
    while (((*subsrt) != '\0') && (result == 0))
    {
        result = TOUPPER(*nptr) - TOUPPER(*subsrt);
        nptr++;
        subsrt++;
    }
    return result;
}